

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

double __thiscall nn::ESoinn::calcAvgDensity(ESoinn *this)

{
  ConcreteLogger *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  uint local_54;
  double dStack_50;
  uint32_t i;
  double sumLocalSignals;
  allocator local_31;
  string local_30;
  ESoinn *local_10;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"calcAvgDensity function",&local_31);
  logger::ConcreteLogger::debug(this_00,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->m_NumEmptyNeurons = 0;
  dStack_50 = 0.0;
  local_54 = 0;
  while( true ) {
    sVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                      (&this->m_Neurons);
    if (sVar2 <= local_54) break;
    pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_54);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar3);
    if (bVar1) {
      this->m_NumEmptyNeurons = this->m_NumEmptyNeurons + 1;
    }
    else {
      pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)local_54);
      dVar5 = neuron::ESoinnNeuron::density(pvVar3);
      dStack_50 = dVar5 + dStack_50;
    }
    local_54 = local_54 + 1;
  }
  sVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                    (&this->m_Neurons);
  lVar4 = sVar2 - this->m_NumEmptyNeurons;
  auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  return dStack_50 /
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
}

Assistant:

double ESoinn::calcAvgDensity()
    {
        log_netw->debug("calcAvgDensity function");
        m_NumEmptyNeurons = 0;
        double sumLocalSignals = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
            {
                m_NumEmptyNeurons++;
                continue;
            }
            sumLocalSignals += m_Neurons[i].density();
        }
        return sumLocalSignals / (double) (m_Neurons.size() - m_NumEmptyNeurons);
    }